

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry_device.cpp
# Opt level: O2

Vec3fa __thiscall
embree::occluded(embree *this,RTCTraversable traversable,RayQueryContext *context,Ray *ray)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 in_XMM1_Qa;
  Vec3fa VVar5;
  Vec3fa transparency;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  RayQueryContext *local_30;
  code *local_28;
  undefined8 local_20;
  
  local_48 = 0x3f800000;
  uStack_44 = 0x3f800000;
  uStack_40 = 0x3f800000;
  uStack_3c = 0x3f800000;
  context->userRayExt = &local_48;
  ray->primID = 0xffffffff;
  ray->geomID = 0xffffffff;
  ray->mask = 0xffffffff;
  local_38 = 0x100004200000000;
  local_20 = 0;
  local_28 = occlusionFilter;
  local_30 = context;
  rtcTraversableOccluded1(traversable,ray);
  context->userRayExt = (void *)0x0;
  uVar1 = 0;
  uVar2 = 0;
  uVar3 = 0;
  uVar4 = 0;
  if (0.0 < ray->tfar || ray->tfar == 0.0) {
    uVar1 = local_48;
    uVar2 = uStack_44;
    uVar3 = uStack_40;
    uVar4 = uStack_3c;
  }
  *(undefined4 *)this = uVar1;
  *(undefined4 *)(this + 4) = uVar2;
  *(undefined4 *)(this + 8) = uVar3;
  *(undefined4 *)(this + 0xc) = uVar4;
  VVar5.field_0.m128[1] = (float)uVar2;
  VVar5.field_0.m128[0] = (float)uVar1;
  VVar5.field_0._8_8_ = in_XMM1_Qa;
  return (Vec3fa)VVar5.field_0;
}

Assistant:

Vec3fa occluded(RTCTraversable traversable, RayQueryContext* context, Ray& ray)
{
  Vec3fa transparency = Vec3fa(1.0f);
  context->userRayExt = &transparency;
  
  ray.geomID = RTC_INVALID_GEOMETRY_ID;
  ray.primID = RTC_INVALID_GEOMETRY_ID;
  ray.mask = -1;

  RTCOccludedArguments args;
  rtcInitOccludedArguments(&args);
  args.context = &context->context;
  args.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
  args.filter = occlusionFilter;
  
  rtcTraversableOccluded1(traversable,RTCRay_(ray),&args);
  context->userRayExt = nullptr;

  if (ray.tfar < 0) return Vec3fa(0.0f);
  else              return transparency;
}